

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O3

Backend * pty_backend_create(Seat *seat,undefined8 param_2,Conf *conf,char **argv,ulong cmd,
                            uint param_6)

{
  int iVar1;
  Backend *pBVar2;
  _Bool _Var3;
  int iVar4;
  __pid_t _Var5;
  uint uVar6;
  int extraout_EAX;
  Pty *pty;
  long lVar7;
  Conf *pCVar8;
  PtyFd *pPVar9;
  ssize_t sVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  int *piVar16;
  uint uVar17;
  PtyFd *e;
  undefined8 *puVar18;
  undefined8 *puVar19;
  char cVar20;
  ulong uVar21;
  long *plVar22;
  byte bVar23;
  char *in_stack_00000518;
  undefined8 *in_stack_00000520;
  char *key;
  termios attrs;
  undefined8 auStack_5c8 [163];
  Backend *local_b0;
  PtyFd *local_a8;
  char *local_a0;
  uint local_94;
  ulong local_90;
  int *local_88;
  Seat *local_80;
  char **local_78;
  termios local_6c;
  
  bVar23 = 0;
  pPVar9 = (PtyFd *)(ulong)param_6;
  cVar20 = (char)param_6;
  local_80 = seat;
  (*seat->vt->set_trust_status)(seat,false);
  local_78 = argv;
  if (single_pty == (Pty *)0x0) {
    pty = (Pty *)safemalloc(1,0x10d0,0);
    memset(pty,0,0x10d0);
    bufchain_init(&pty->output_data);
    pty->master_fd = -1;
    pty->slave_fd = -1;
    pty_stamped_utmp = 0;
  }
  else {
    pty = single_pty;
    if (single_pty->conf != (Conf *)0x0) {
      __assert_fail("pty->conf == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pty.c",
                    0x373,
                    "Backend *pty_backend_create(Seat *, LogContext *, Conf *, char **, const char *, struct ssh_ttymodes, _Bool, const char *, const char *const *)"
                   );
    }
  }
  piVar16 = pty->pipefds;
  pty->pipefds[0] = -1;
  pty->pipefds[1] = -1;
  pty->pipefds[2] = -1;
  pty->pipefds[3] = -1;
  pty->pipefds[4] = -1;
  pty->pipefds[5] = -1;
  local_a8 = pty->fds;
  lVar7 = 0x30;
  do {
    *(undefined4 *)((long)pty->pipefds + lVar7 + -0x18) = 0xffffffff;
    *(Pty **)((long)pty->pipefds + lVar7 + -0x10) = pty;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x60);
  if (pty_signal_pipe[0] < 0) {
    iVar4 = pipe(pty_signal_pipe);
    if (-1 < iVar4) {
      cloexec(pty_signal_pipe[0]);
      cloexec(pty_signal_pipe[1]);
      goto LAB_001133b7;
    }
LAB_00113a10:
    uVar6 = (uint)cmd;
    pty_backend_create_cold_4();
    iVar4 = extraout_EAX;
  }
  else {
LAB_001133b7:
    pty->seat = local_80;
    (pty->backend).vt = &pty_backend;
    pCVar8 = conf_copy(conf);
    pty->conf = pCVar8;
    iVar4 = conf_get_int(conf,0x7d);
    pty->term_width = iVar4;
    iVar4 = conf_get_int(conf,0x7e);
    pty->term_height = iVar4;
    if (ptyfds == (tree234 *)0x0) {
      ptyfds = newtree234(ptyfd_compare);
    }
    local_b0 = &pty->backend;
    iVar4 = pty->master_fd;
    local_94 = param_6;
    local_90 = cmd;
    local_88 = piVar16;
    if (cVar20 == '\0') {
      if (iVar4 < 0) {
        pty_open_master(pty);
      }
      if (-1 < pty_utmp_helper_pipe) {
        _Var3 = conf_get_bool(conf,0xc4);
        if (_Var3) {
          pcVar11 = (*pty->seat->vt->get_x_display)(pty->seat);
          pPVar9 = (PtyFd *)strlen(pcVar11);
          if ((uint)pPVar9 < 0x7fffffff) {
            uVar6 = (uint)pPVar9 + 1;
            pPVar9 = (PtyFd *)(ulong)uVar6;
            cmd = 0;
            do {
              sVar10 = write(pty_utmp_helper_pipe,pcVar11 + cmd,(long)(int)(uVar6 - (int)cmd));
              if ((int)sVar10 < 0) {
                perror("pterm: writing to utmp helper process");
                goto LAB_00113595;
              }
              uVar17 = (int)cmd + (int)sVar10;
              cmd = (ulong)uVar17;
            } while ((int)uVar17 < (int)uVar6);
          }
        }
        else {
LAB_00113595:
          close(pty_utmp_helper_pipe);
          pty_utmp_helper_pipe = -1;
        }
      }
      iVar4 = pty->master_fd;
      pty->master_i = iVar4;
      pty->master_o = iVar4;
      pty->master_e = -1;
      pty->fds[0].fd = iVar4;
      e = local_a8;
    }
    else {
      if ((-1 < iVar4) && (close(iVar4), -1 < pty_utmp_helper_pipe)) {
        close(pty_utmp_helper_pipe);
        pty_utmp_helper_pipe = -1;
      }
      uVar21 = 0xfffffffffffffffe;
      do {
        iVar4 = pipe(piVar16);
        if (iVar4 < 0) {
          (*local_b0->vt->free)(local_b0);
          return (Backend *)0x0;
        }
        uVar21 = uVar21 + 2;
        piVar16 = piVar16 + 2;
      } while (uVar21 < 4);
      iVar4 = pty->pipefds[1];
      iVar1 = pty->pipefds[2];
      pty->master_i = iVar4;
      pty->fds[0].fd = iVar4;
      pty->master_o = iVar1;
      pty->fds[1].fd = iVar1;
      iVar4 = pty->pipefds[4];
      pty->master_e = iVar4;
      pPVar9 = pty->fds + 2;
      pty->fds[2].fd = iVar4;
      add234(ptyfds,local_a8);
      add234(ptyfds,pty->fds + 1);
      e = pPVar9;
    }
    cVar20 = (char)pPVar9;
    add234(ptyfds,e);
    if (pty_setup_sigchld_handler_setup == '\0') {
      putty_signal(0x11,sigchld_handler);
      pty_setup_sigchld_handler_setup = '\x01';
    }
    _Var5 = fork();
    piVar16 = local_88;
    plVar22 = _environ;
    if (_Var5 < 0) {
      pty_backend_create_cold_3();
    }
    else {
      if (_Var5 != 0) {
        pty->child_pid = _Var5;
        pty->child_dead = false;
        pty->finished = false;
        if (0 < pty->slave_fd) {
          close(pty->slave_fd);
        }
        if (ptys_by_pid == (tree234 *)0x0) {
          ptys_by_pid = newtree234(pty_compare_by_pid);
        }
        iVar4 = *piVar16;
        if (-1 < iVar4) {
          close(iVar4);
          *piVar16 = -1;
        }
        if (-1 < pty->pipefds[3]) {
          close(pty->pipefds[3]);
          pty->pipefds[3] = -1;
        }
        if (-1 < pty->pipefds[5]) {
          close(pty->pipefds[5]);
          pty->pipefds[5] = -1;
        }
        add234(ptys_by_pid,pty);
        pty_uxsel_setup(pty);
        return local_b0;
      }
      if ((pty_osx_envrestore_prefix != (char *)0x0) &&
         (pcVar11 = (char *)*_environ, pcVar11 != (char *)0x0)) {
        sVar14 = strlen(pty_osx_envrestore_prefix);
        local_b0 = (Backend *)(long)(int)sVar14;
        pcVar12 = pty_osx_envrestore_prefix;
        do {
          while( true ) {
            iVar4 = strncmp(pcVar11,pcVar12,(size_t)local_b0);
            pBVar2 = local_b0;
            if (iVar4 == 0) break;
            pcVar11 = (char *)plVar22[1];
            plVar22 = plVar22 + 1;
            if (pcVar11 == (char *)0x0) goto LAB_001136dc;
          }
          local_a8 = (PtyFd *)CONCAT71(local_a8._1_7_,pcVar11[(long)local_b0]);
          sVar14 = strcspn(pcVar11,"=");
          pcVar12 = dupprintf("%.*s",sVar14 & 0xffffffff,pcVar11);
          sVar14 = strcspn(pcVar11,"=");
          pcVar11 = dupstr(pcVar11 + ((sVar14 + 1) - (ulong)(pcVar11[sVar14] == '\0')));
          if ((char)local_a8 == 'u') {
            unsetenv(pcVar12 + (long)pBVar2 + 1);
          }
          else {
            setenv(pcVar12 + (long)pBVar2 + 1,pcVar11,1);
          }
          unsetenv(pcVar12);
          safefree(pcVar12);
          safefree(pcVar11);
          pcVar11 = (char *)*_environ;
          plVar22 = _environ;
          pcVar12 = pty_osx_envrestore_prefix;
        } while (pcVar11 != (char *)0x0);
      }
LAB_001136dc:
      uVar6 = getpid();
      cmd = (ulong)uVar6;
      cVar20 = (char)local_94;
      if (cVar20 != '\0') {
        pty_backend_create_cold_2();
        goto LAB_00113706;
      }
    }
    uVar6 = (uint)cmd;
    iVar4 = pty_open_slave(pty);
    if (iVar4 < 0) {
      pty_backend_create_cold_1();
      goto LAB_00113a10;
    }
  }
  close(pty->master_fd);
  noncloexec(iVar4);
  dup2(iVar4,0);
  dup2(iVar4,1);
  dup2(iVar4,2);
  close(iVar4);
  setsid();
  ioctl(0,0x540e,1);
  tcsetpgrp(0,uVar6);
  iVar4 = tcgetattr(0,&local_6c);
  if (iVar4 == 0) {
    _Var3 = conf_get_bool(conf,0x48);
    local_6c.c_cc[2] = '\b';
    if (_Var3) {
      local_6c.c_cc[2] = '\x7f';
    }
    _Var3 = (*local_80->vt->is_utf8)(local_80);
    local_6c.c_iflag = (uint)_Var3 << 0xe | local_6c.c_iflag & 0xffffbfff;
    puVar18 = (undefined8 *)&stack0x00000008;
    puVar19 = auStack_5c8;
    for (lVar7 = 0xa1; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar19 = *puVar18;
      puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
      puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
    }
    copy_ttymodes_into_termios();
    tcsetattr(0,0,&local_6c);
  }
  setpgid(uVar6,uVar6);
  iVar4 = open(pty->name,1,0);
  if (-1 < iVar4) {
    close(iVar4);
  }
LAB_00113706:
  setpgid(uVar6,uVar6);
  if (in_stack_00000520 != (undefined8 *)0x0) {
    pcVar11 = (char *)*in_stack_00000520;
    while (pcVar11 != (char *)0x0) {
      in_stack_00000520 = in_stack_00000520 + 1;
      unsetenv(pcVar11);
      pcVar11 = (char *)*in_stack_00000520;
    }
  }
  uVar21 = local_90;
  if (cVar20 == '\0') {
    pcVar11 = conf_get_str(conf,0x35);
    pcVar11 = dupprintf("TERM=%s",pcVar11);
    putenv(pcVar11);
  }
  pcVar11 = conf_get_str_strs(conf,0x38,(char *)0x0,&local_a0);
  if (pcVar11 != (char *)0x0) {
    do {
      pcVar11 = dupcat_fn(local_a0,"=",pcVar11,0);
      putenv(pcVar11);
      pcVar11 = conf_get_str_strs(conf,0x38,local_a0,&local_a0);
    } while (pcVar11 != (char *)0x0);
  }
  if (in_stack_00000518 != (char *)0x0) {
    chdir(in_stack_00000518);
  }
  putty_signal(2,(_func_void_int *)0x0);
  putty_signal(3,(_func_void_int *)0x0);
  putty_signal(0xd,(_func_void_int *)0x0);
  block_signal(0xd,false);
  if (local_78 == (char **)0x0 && uVar21 == 0) {
    pcVar12 = getenv("SHELL");
    pcVar11 = "/bin/sh";
    if (pcVar12 != (char *)0x0) {
      pcVar11 = pcVar12;
    }
    _Var3 = conf_get_bool(conf,0xc5);
    pcVar12 = pcVar11;
    if (_Var3) {
      pcVar13 = strrchr(pcVar11,0x2f);
      sVar14 = strlen(pcVar11);
      pcVar12 = (char *)safemalloc(sVar14 + 2,1,0);
      pcVar15 = pcVar13 + 1;
      if (pcVar13 == (char *)0x0) {
        pcVar15 = pcVar11;
      }
      sprintf(pcVar12,"-%s",pcVar15);
    }
    execl(pcVar11,pcVar12,0);
  }
  else {
    if (local_78 != (char **)0x0) {
      execvp(*local_78,local_78);
    }
    if ((uVar21 != 0) && (pcVar11 = getenv("SHELL"), pcVar11 != (char *)0x0)) {
      execl(pcVar11,pcVar11,"-c",uVar21,0);
    }
  }
  perror("exec");
  _exit(0x7f);
}

Assistant:

Backend *pty_backend_create(
    Seat *seat, LogContext *logctx, Conf *conf, char **argv, const char *cmd,
    struct ssh_ttymodes ttymodes, bool pipes_instead, const char *dir,
    const char *const *env_vars_to_unset)
{
    int slavefd;
    pid_t pid, pgrp;
#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
    bool got_windowid;
    long windowid;
#endif
    Pty *pty;
    int i;

    /* No local authentication phase in this protocol */
    seat_set_trust_status(seat, false);

    if (single_pty) {
        pty = single_pty;
        assert(pty->conf == NULL);
    } else {
        pty = new_pty_struct();
        pty->master_fd = pty->slave_fd = -1;
#ifndef OMIT_UTMP
        pty_stamped_utmp = false;
#endif
    }
    for (i = 0; i < 6; i++)
        pty->pipefds[i] = -1;
    for (i = 0; i < 3; i++) {
        pty->fds[i].fd = -1;
        pty->fds[i].pty = pty;
    }

    if (pty_signal_pipe[0] < 0) {
        if (pipe(pty_signal_pipe) < 0) {
            perror("pipe");
            exit(1);
        }
        cloexec(pty_signal_pipe[0]);
        cloexec(pty_signal_pipe[1]);
    }

    pty->seat = seat;
    pty->backend.vt = &pty_backend;

    pty->conf = conf_copy(conf);
    pty->term_width = conf_get_int(conf, CONF_width);
    pty->term_height = conf_get_int(conf, CONF_height);

    if (!ptyfds)
        ptyfds = newtree234(ptyfd_compare);

    if (pipes_instead) {
        if (pty->master_fd >= 0) {
            /* If somehow we've got a pty master already and don't
             * need it, throw it away! */
            close(pty->master_fd);
#ifndef OMIT_UTMP
            if (pty_utmp_helper_pipe >= 0) {
                close(pty_utmp_helper_pipe); /* don't need this either */
                pty_utmp_helper_pipe = -1;
            }
#endif
        }


        for (i = 0; i < 6; i += 2) {
            if (pipe(pty->pipefds + i) < 0) {
                backend_free(&pty->backend);
                return NULL;
            }
        }

        pty->fds[0].fd = pty->master_i = pty->pipefds[1];
        pty->fds[1].fd = pty->master_o = pty->pipefds[2];
        pty->fds[2].fd = pty->master_e = pty->pipefds[4];

        add234(ptyfds, &pty->fds[0]);
        add234(ptyfds, &pty->fds[1]);
        add234(ptyfds, &pty->fds[2]);
    } else {
        if (pty->master_fd < 0)
            pty_open_master(pty);

#ifndef OMIT_UTMP
        /*
         * Stamp utmp (that is, tell the utmp helper process to do so),
         * or not.
         */
        if (pty_utmp_helper_pipe >= 0) {   /* if it's < 0, we can't anyway */
            if (!conf_get_bool(conf, CONF_stamp_utmp)) {
                /* We're not stamping utmp, so just let the child
                 * process die that was waiting to unstamp it later. */
                close(pty_utmp_helper_pipe);
                pty_utmp_helper_pipe = -1;
            } else {
                const char *location = seat_get_x_display(pty->seat);
                int len = strlen(location)+1, pos = 0; /* +1 to include NUL */
                while (pos < len) {
                    int ret = write(pty_utmp_helper_pipe,
                                    location + pos, len - pos);
                    if (ret < 0) {
                        perror("pterm: writing to utmp helper process");
                        close(pty_utmp_helper_pipe); /* arrgh, just give up */
                        pty_utmp_helper_pipe = -1;
                        break;
                    }
                    pos += ret;
                }
            }
        }
#endif

        pty->master_i = pty->master_fd;
        pty->master_o = pty->master_fd;
        pty->master_e = -1;

        pty->fds[0].fd = pty->master_fd;
        add234(ptyfds, &pty->fds[0]);
    }

#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
    got_windowid = seat_get_windowid(pty->seat, &windowid);
#endif

    /*
     * Set up the signal handler to catch SIGCHLD, if pty_pre_init
     * didn't already do it.
     */
    pty_setup_sigchld_handler();

    /*
     * Fork and execute the command.
     */
    pid = fork();
    if (pid < 0) {
        perror("fork");
        exit(1);
    }

    if (pid == 0) {
        struct termios attrs;

        /*
         * We are the child.
         */

        if (pty_osx_envrestore_prefix) {
            int plen = strlen(pty_osx_envrestore_prefix);
            extern char **environ;
            char **ep;

          restart_osx_env_restore:
            for (ep = environ; *ep; ep++) {
                char *e = *ep;

                if (!strncmp(e, pty_osx_envrestore_prefix, plen)) {
                    bool unset = (e[plen] == 'u');
                    char *pname = dupprintf("%.*s", (int)strcspn(e, "="), e);
                    char *name = pname + plen + 1;
                    char *value = e + strcspn(e, "=");
                    if (*value) value++;
                    value = dupstr(value);
                    if (unset)
                        unsetenv(name);
                    else
                        setenv(name, value, 1);
                    unsetenv(pname);
                    sfree(pname);
                    sfree(value);
                    goto restart_osx_env_restore;
                }
            }
        }

        pgrp = getpid();

        if (pipes_instead) {
            int i;
            dup2(pty->pipefds[0], 0);
            dup2(pty->pipefds[3], 1);
            dup2(pty->pipefds[5], 2);
            for (i = 0; i < 6; i++)
                close(pty->pipefds[i]);

            setsid();
        } else {
            slavefd = pty_open_slave(pty);
            if (slavefd < 0) {
                perror("slave pty: open");
                _exit(1);
            }

            close(pty->master_fd);
            noncloexec(slavefd);
            dup2(slavefd, 0);
            dup2(slavefd, 1);
            dup2(slavefd, 2);
            close(slavefd);
            setsid();
#ifdef TIOCSCTTY
            ioctl(0, TIOCSCTTY, 1);
#endif
            tcsetpgrp(0, pgrp);

            /*
             * Set up configuration-dependent termios settings on the new
             * pty. Linux would have let us do this on the pty master
             * before we forked, but that fails on OS X, so we do it here
             * instead.
             */
            if (tcgetattr(0, &attrs) == 0) {
                /*
                 * Set the backspace character to be whichever of ^H and
                 * ^? is specified by bksp_is_delete.
                 */
                attrs.c_cc[VERASE] = conf_get_bool(conf, CONF_bksp_is_delete)
                    ? '\177' : '\010';

                /*
                 * Set the IUTF8 bit iff the character set is UTF-8.
                 */
#ifdef IUTF8
                if (seat_is_utf8(seat))
                    attrs.c_iflag |= IUTF8;
                else
                    attrs.c_iflag &= ~IUTF8;
#endif

                copy_ttymodes_into_termios(&attrs, ttymodes);

                tcsetattr(0, TCSANOW, &attrs);
            }
        }

        setpgid(pgrp, pgrp);
        if (!pipes_instead) {
            int ptyfd = open(pty->name, O_WRONLY, 0);
            if (ptyfd >= 0)
                close(ptyfd);
        }
        setpgid(pgrp, pgrp);

        if (env_vars_to_unset)
            for (const char *const *p = env_vars_to_unset; *p; p++)
                unsetenv(*p);

        if (!pipes_instead) {
            char *term_env_var = dupprintf("TERM=%s",
                                           conf_get_str(conf, CONF_termtype));
            putenv(term_env_var);
            /* We mustn't free term_env_var, as putenv links it into the
             * environment in place.
             */
        }
#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
        if (got_windowid) {
            char *windowid_env_var = dupprintf("WINDOWID=%ld", windowid);
            putenv(windowid_env_var);
            /* We mustn't free windowid_env_var, as putenv links it into the
             * environment in place.
             */
        }
        {
            /*
             * In case we were invoked with a --display argument that
             * doesn't match DISPLAY in our actual environment, we
             * should set DISPLAY for processes running inside the
             * terminal to match the display the terminal itself is
             * on.
             */
            const char *x_display = seat_get_x_display(pty->seat);
            if (x_display) {
                char *x_display_env_var = dupprintf("DISPLAY=%s", x_display);
                putenv(x_display_env_var);
                /* As above, we don't free this. */
            } else {
                unsetenv("DISPLAY");
            }
        }
#endif
        {
            char *key, *val;

            for (val = conf_get_str_strs(conf, CONF_environmt, NULL, &key);
                 val != NULL;
                 val = conf_get_str_strs(conf, CONF_environmt, key, &key)) {
                char *varval = dupcat(key, "=", val);
                putenv(varval);
                /*
                 * We must not free varval, since putenv links it
                 * into the environment _in place_. Weird, but
                 * there we go. Memory usage will be rationalised
                 * as soon as we exec anyway.
                 */
            }
        }

        if (dir) {
            if (chdir(dir) < 0) {
                /* Ignore the error - nothing we can sensibly do about it,
                 * and our existing cwd is as good a fallback as any. */
            }
        }

        /*
         * SIGINT, SIGQUIT and SIGPIPE may have been set to ignored by
         * our parent, particularly by things like sh -c 'pterm &' and
         * some window or session managers. SIGPIPE was also
         * (potentially) blocked by us during startup. Reverse all
         * this for our child process.
         */
        putty_signal(SIGINT, SIG_DFL);
        putty_signal(SIGQUIT, SIG_DFL);
        putty_signal(SIGPIPE, SIG_DFL);
        block_signal(SIGPIPE, false);
        if (argv || cmd) {
            /*
             * If we were given a separated argument list, try to exec
             * it.
             */
            if (argv) {
                execvp(argv[0], argv);
            }
            /*
             * Otherwise, if we were given a single command string,
             * try passing that to $SHELL -c.
             *
             * In the case of pterm, this system of fallbacks arranges
             * that we can _either_ follow 'pterm -e' with a list of
             * argv elements to be fed directly to exec, _or_ with a
             * single argument containing a command to be parsed by a
             * shell (but, in cases of doubt, the former is more
             * reliable). We arrange this by setting argv to the full
             * argument list, and also setting cmd to the single
             * element of argv if it's a length-1 list.
             *
             * A quick survey of other terminal emulators' -e options
             * (as of Debian squeeze) suggests that:
             *
             *  - xterm supports both modes, more or less like this
             *  - gnome-terminal will only accept a one-string shell command
             *  - Eterm, kterm and rxvt will only accept a list of
             *    argv elements (as did older versions of pterm).
             *
             * It therefore seems important to support both usage
             * modes in order to be a drop-in replacement for either
             * xterm or gnome-terminal, and hence for anyone's
             * plausible uses of the Debian-style alias
             * 'x-terminal-emulator'.
             *
             * In other use cases, a caller can set only one of argv
             * and cmd to get a fixed handling of the input.
             */
            if (cmd) {
                char *shell = getenv("SHELL");
                if (shell)
                    execl(shell, shell, "-c", cmd, (void *)NULL);
            }
        } else {
            const char *shell = getenv("SHELL");
            if (!shell)
                shell = "/bin/sh";
            char *shellname;
            if (conf_get_bool(conf, CONF_login_shell)) {
                const char *p = strrchr(shell, '/');
                shellname = snewn(2+strlen(shell), char);
                p = p ? p+1 : shell;
                sprintf(shellname, "-%s", p);
            } else
                shellname = (char *)shell;
            execl(shell, shellname, (void *)NULL);
        }

        /*
         * If we're here, exec has gone badly foom.
         */
        perror("exec");
        _exit(127);
    } else {
        pty->child_pid = pid;
        pty->child_dead = false;
        pty->finished = false;
        if (pty->slave_fd > 0)
            close(pty->slave_fd);
        if (!ptys_by_pid)
            ptys_by_pid = newtree234(pty_compare_by_pid);
        if (pty->pipefds[0] >= 0) {
            close(pty->pipefds[0]);
            pty->pipefds[0] = -1;
        }
        if (pty->pipefds[3] >= 0) {
            close(pty->pipefds[3]);
            pty->pipefds[3] = -1;
        }
        if (pty->pipefds[5] >= 0) {
            close(pty->pipefds[5]);
            pty->pipefds[5] = -1;
        }
        add234(ptys_by_pid, pty);
    }

    pty_uxsel_setup(pty);

    return &pty->backend;
}